

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.cpp
# Opt level: O1

bool duckdb::SkipToCloseQuotes(StringCastInputState *input_state)

{
  char cVar1;
  char cVar2;
  char *pcVar3;
  idx_t *piVar4;
  ulong *puVar5;
  idx_t iVar6;
  byte bVar7;
  bool bVar8;
  
  pcVar3 = input_state->buf;
  piVar4 = input_state->pos;
  puVar5 = input_state->len;
  iVar6 = *piVar4;
  cVar1 = pcVar3[iVar6];
  bVar7 = input_state->escaped;
  do {
    iVar6 = iVar6 + 1;
    *piVar4 = iVar6;
    bVar8 = iVar6 < *puVar5;
    if (!bVar8) {
      return bVar8;
    }
    cVar2 = pcVar3[iVar6];
    if (cVar2 == '\\') {
      bVar7 = bVar7 ^ 1;
    }
    else {
      if ((cVar2 == cVar1) && ((bVar7 & 1) == 0)) {
        return bVar8;
      }
      bVar7 = false;
    }
    input_state->escaped = (bool)bVar7;
  } while( true );
}

Assistant:

static bool SkipToCloseQuotes(StringCastInputState &input_state) {
	auto &buf = input_state.buf;
	auto &pos = input_state.pos;
	auto &len = input_state.len;
	auto &escaped = input_state.escaped;

	char quote = buf[pos];
	pos++;

	while (pos < len) {
		bool set_escaped = false;
		if (buf[pos] == '\\') {
			if (!escaped) {
				set_escaped = true;
			}
		} else {
			if (buf[pos] == quote && !escaped) {
				return true;
			}
		}
		escaped = set_escaped;
		pos++;
	}
	return false;
}